

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::InputFile::multiPartInitialize(InputFile *this,InputPartData *part)

{
  Data *pDVar1;
  
  pDVar1 = this->_data;
  pDVar1->_streamData = part->mutex;
  pDVar1->version = part->version;
  Header::operator=(&pDVar1->header,&part->header);
  pDVar1 = this->_data;
  pDVar1->partNumber = part->partNumber;
  pDVar1->part = part;
  initialize(this);
  return;
}

Assistant:

void
InputFile::multiPartInitialize (InputPartData* part)
{
    _data->_streamData = part->mutex;
    _data->version = part->version;
    _data->header = part->header;
    _data->partNumber = part->partNumber;
    _data->part = part;

    initialize();
}